

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O1

void M68K_printInst(MCInst *MI,SStream *O,void *PrinterInfo)

{
  cs_m68k *inst;
  int iVar1;
  cs_detail *__dest;
  byte bVar2;
  cs_m68k *op;
  char *s;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  
  inst = (cs_m68k *)((long)PrinterInfo + 0x30);
  __dest = MI->flat_insn->detail;
  if (__dest != (cs_detail *)0x0) {
    bVar2 = (byte)*(undefined4 *)((long)PrinterInfo + 0x148);
    bVar4 = 0x10;
    if (bVar2 < 0x10) {
      bVar4 = bVar2;
    }
    bVar2 = 0x14;
    if (*(byte *)((long)PrinterInfo + 0x172) < 0x14) {
      bVar2 = *(byte *)((long)PrinterInfo + 0x172);
    }
    bVar3 = 8;
    if (*(byte *)((long)PrinterInfo + 0x17b) < 8) {
      bVar3 = *(byte *)((long)PrinterInfo + 0x17b);
    }
    memcpy(&__dest->field_6,inst,0xf0);
    memcpy(__dest,(void *)((long)PrinterInfo + 0x120),(ulong)(byte)(bVar4 * '\x02'));
    __dest->regs_read_count = bVar4;
    memcpy(__dest->regs_write,(void *)((long)PrinterInfo + 0x14a),(ulong)(byte)(bVar2 * '\x02'));
    __dest->regs_write_count = bVar2;
    memcpy(__dest->groups,(void *)((long)PrinterInfo + 0x173),(ulong)bVar3);
    __dest->groups_count = bVar3;
  }
  if ((ulong)MI->Opcode == 0) {
    if (*(char *)((long)PrinterInfo + 0x118) != '\0') {
      SStream_concat(O,"dc.w $%x",inst->operands[0].field_0.imm);
      return;
    }
    SStream_concat(O,"dc.w $<unknown>");
    return;
  }
  SStream_concat0(O,s_instruction_names[MI->Opcode]);
  if (*(int *)((long)PrinterInfo + 0x110) == 2) {
    iVar1 = *(int *)((long)PrinterInfo + 0x114);
    if (iVar1 == 4) {
      s = ".s";
    }
    else if (iVar1 == 0xc) {
      s = ".x";
    }
    else {
      if (iVar1 != 8) goto LAB_0026c4fb;
      s = ".d";
    }
  }
  else {
    if (*(int *)((long)PrinterInfo + 0x110) != 1) goto LAB_0026c4fb;
    iVar1 = *(int *)((long)PrinterInfo + 0x114);
    if (iVar1 == 1) {
      s = ".b";
    }
    else if (iVar1 == 4) {
      s = ".l";
    }
    else {
      if (iVar1 != 2) goto LAB_0026c4fb;
      s = ".w";
    }
  }
  SStream_concat0(O,s);
LAB_0026c4fb:
  SStream_concat0(O," ");
  if (MI->Opcode == 0x2c) {
    printAddressingMode(O,*(uint *)((long)PrinterInfo + 0x20),inst,(cs_m68k_op *)inst);
    SStream_concat0(O,",");
    printAddressingMode(O,*(uint *)((long)PrinterInfo + 0x20),inst,
                        (cs_m68k_op *)((long)PrinterInfo + 0x68));
    SStream_concat0(O,",");
    SStream_concat(O,"(%s):(%s)",s_reg_names[(ulong)(*(uint *)((long)PrinterInfo + 0xcc) >> 4) + 1],
                   s_reg_names[(ulong)(*(uint *)((long)PrinterInfo + 0xcc) & 0xf) + 1]);
    return;
  }
  if (*(char *)((long)PrinterInfo + 0x118) != '\0') {
    uVar5 = 0;
    op = inst;
    do {
      printAddressingMode(O,*(uint *)((long)PrinterInfo + 0x20),inst,op->operands);
      uVar5 = uVar5 + 1;
      if (uVar5 != *(byte *)((long)PrinterInfo + 0x118)) {
        SStream_concat(O,",%s"," ");
      }
      op = (cs_m68k *)(op->operands + 1);
    } while (uVar5 < *(byte *)((long)PrinterInfo + 0x118));
  }
  return;
}

Assistant:

void M68K_printInst(MCInst* MI, SStream* O, void* PrinterInfo)
{
#ifndef CAPSTONE_DIET
	m68k_info *info = (m68k_info *)PrinterInfo;
	cs_m68k *ext = &info->extension;
	cs_detail *detail = NULL;
	int i = 0;

	detail = MI->flat_insn->detail;
	if (detail) {
		int regs_read_count = m68k_min(m68k_sizeof_array(detail->regs_read), info->regs_read_count);
		int regs_write_count = m68k_min(m68k_sizeof_array(detail->regs_write), info->regs_write_count);
		int groups_count = m68k_min(m68k_sizeof_array(detail->groups), info->groups_count);

		memcpy(&detail->m68k, ext, sizeof(cs_m68k));

		memcpy(&detail->regs_read, &info->regs_read, regs_read_count * sizeof(uint16_t));
		detail->regs_read_count = regs_read_count;

		memcpy(&detail->regs_write, &info->regs_write, regs_write_count * sizeof(uint16_t));
		detail->regs_write_count = regs_write_count;

		memcpy(&detail->groups, &info->groups, groups_count);
		detail->groups_count = groups_count;
	}

	if (MI->Opcode == M68K_INS_INVALID) {
		if (ext->op_count)
			SStream_concat(O, "dc.w $%x", ext->operands[0].imm);
		else
			SStream_concat(O, "dc.w $<unknown>");
		return;
	}

	SStream_concat0(O, (char*)s_instruction_names[MI->Opcode]);

	switch (ext->op_size.type) {
		case M68K_SIZE_TYPE_INVALID :
			break;

		case M68K_SIZE_TYPE_CPU :
			switch (ext->op_size.cpu_size) {
				case M68K_CPU_SIZE_BYTE: SStream_concat0(O, ".b"); break;
				case M68K_CPU_SIZE_WORD: SStream_concat0(O, ".w"); break;
				case M68K_CPU_SIZE_LONG: SStream_concat0(O, ".l"); break;
				case M68K_CPU_SIZE_NONE: break;
			}
			break;

		case M68K_SIZE_TYPE_FPU :
			switch (ext->op_size.fpu_size) {
				case M68K_FPU_SIZE_SINGLE: SStream_concat0(O, ".s"); break;
				case M68K_FPU_SIZE_DOUBLE: SStream_concat0(O, ".d"); break;
				case M68K_FPU_SIZE_EXTENDED: SStream_concat0(O, ".x"); break;
				case M68K_FPU_SIZE_NONE: break;
			}
			break;
	}

	SStream_concat0(O, " ");

	// this one is a bit spacial so we do special things

	if (MI->Opcode == M68K_INS_CAS2) {
		int reg_value_0, reg_value_1;
		printAddressingMode(O, info->pc, ext, &ext->operands[0]); SStream_concat0(O, ",");
		printAddressingMode(O, info->pc, ext, &ext->operands[1]); SStream_concat0(O, ",");
		reg_value_0 = ext->operands[2].register_bits >> 4;
		reg_value_1 = ext->operands[2].register_bits & 0xf;
		SStream_concat(O, "(%s):(%s)", s_reg_names[M68K_REG_D0 + reg_value_0], s_reg_names[M68K_REG_D0 + reg_value_1]);
		return;
	}

	for (i  = 0; i < ext->op_count; ++i) {
		printAddressingMode(O, info->pc, ext, &ext->operands[i]);
		if ((i + 1) != ext->op_count)
			SStream_concat(O, ",%s", s_spacing);
	}
#endif
}